

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

EndsWithMatcher *
Catch::Matchers::EndsWith
          (EndsWithMatcher *__return_storage_ptr__,string *str,Choice caseSensitivity)

{
  CasedString local_40;
  
  local_40.m_caseSensitivity = caseSensitivity;
  StdString::CasedString::adjustString(&local_40.m_str,&local_40,str);
  StdString::EndsWithMatcher::EndsWithMatcher(__return_storage_ptr__,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.m_str._M_dataplus._M_p != &local_40.m_str.field_2) {
    operator_delete(local_40.m_str._M_dataplus._M_p,local_40.m_str.field_2._M_allocated_capacity + 1
                   );
  }
  return __return_storage_ptr__;
}

Assistant:

StdString::EndsWithMatcher EndsWith(std::string const& str, CaseSensitive::Choice caseSensitivity) {
            return StdString::EndsWithMatcher(StdString::CasedString(str, caseSensitivity));
        }